

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool trans_SEL(DisasContext_conflict1 *s,arg_rrr *a)

{
  TCGContext_conflict1 *tcg_ctx;
  ulong uVar1;
  TCGv_i32 var;
  TCGv_i32 pTVar2;
  TCGv_i32 ret;
  uintptr_t o;
  uintptr_t o_1;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  tcg_ctx = s->uc->tcg_ctx;
  if (s->thumb == 0) {
    uVar1 = s->features & 8;
  }
  else {
    uVar1 = s->features >> 0x22 & 1;
  }
  if (uVar1 != 0) {
    var = load_reg(s,a->rn);
    pTVar2 = load_reg(s,a->rm);
    ret = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_ld_i32(tcg_ctx,ret,tcg_ctx->cpu_env,0x21c);
    local_40 = (TCGTemp *)(var + (long)&tcg_ctx->pool_cur);
    local_48 = (TCGTemp *)(ret + (long)tcg_ctx);
    local_38 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
    tcg_gen_callN_aarch64(tcg_ctx,helper_sel_flags_aarch64,local_40,3,&local_48);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
    store_reg(s,a->rd,var);
  }
  return uVar1 != 0;
}

Assistant:

static bool trans_SEL(DisasContext *s, arg_rrr *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t1, t2, t3;

    if (s->thumb
        ? !arm_dc_feature(s, ARM_FEATURE_THUMB_DSP)
        : !ENABLE_ARCH_6) {
        return false;
    }

    t1 = load_reg(s, a->rn);
    t2 = load_reg(s, a->rm);
    t3 = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_ld_i32(tcg_ctx, t3, tcg_ctx->cpu_env, offsetof(CPUARMState, GE));
    gen_helper_sel_flags(tcg_ctx, t1, t3, t1, t2);
    tcg_temp_free_i32(tcg_ctx, t3);
    tcg_temp_free_i32(tcg_ctx, t2);
    store_reg(s, a->rd, t1);
    return true;
}